

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.c
# Opt level: O0

void uniprocessor_check(nsync_atomic_uint32_ *state,is_uniprocessor_s *s)

{
  uint uVar1;
  is_uniprocessor_s *s_local;
  nsync_atomic_uint32_ *state_local;
  
  do {
    uVar1 = std::atomic_load_explicit<unsigned_int>(state,memory_order_acquire);
  } while (uVar1 != 1);
  while (uVar1 = std::atomic_load_explicit<unsigned_int>(state,memory_order_acquire), uVar1 == 1) {
    s->count = s->count + 1.0;
  }
  std::atomic_store_explicit<unsigned_int>(&s->done,1,memory_order_release);
  return;
}

Assistant:

static void uniprocessor_check (nsync_atomic_uint32_ *state, struct is_uniprocessor_s *s) {
	IGNORE_RACES_START ();
	while (ATM_LOAD_ACQ (state) != 1) {
	}
	while (ATM_LOAD_ACQ (state) == 1) {
		s->count++;
	}
	ATM_STORE_REL (&s->done, 1);
	IGNORE_RACES_END ();
}